

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O0

void __thiscall ColorTracker::~ColorTracker(ColorTracker *this)

{
  byte bVar1;
  ostream *poVar2;
  void *pvVar3;
  ColorTracker *this_local;
  
  bVar1 = cv::VideoCapture::isOpened();
  if ((bVar1 & 1) != 0) {
    cv::VideoCapture::release();
    bVar1 = cv::VideoCapture::isOpened();
    if ((bVar1 & 1) == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"succeeded to release camera: ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,this->cameraId);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"failed to release camera: ");
      pvVar3 = (void *)std::ostream::operator<<(poVar2,this->cameraId);
      std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  cv::VideoCapture::~VideoCapture(&this->cap);
  return;
}

Assistant:

ColorTracker::~ColorTracker() noexcept{
    if (!this->cap.isOpened()){
        return;
    }
    this->cap.release();
	if (!this->cap.isOpened()) {
		cout << "succeeded to release camera: " << this->cameraId << endl;
	} else {
		cout << "failed to release camera: " << this->cameraId << endl;
	}
}